

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O3

void __thiscall QOpenGLWindowPrivate::beginPaint(QOpenGLWindowPrivate *this,QRegion *region)

{
  long *plVar1;
  QOpenGLFramebufferObject *pQVar2;
  QOpenGLWindowPaintDevice *this_00;
  int iVar3;
  int extraout_var;
  QSize QVar4;
  QOpenGLFramebufferObject *this_01;
  long *plVar5;
  socklen_t __len;
  int extraout_EDX;
  int extraout_var_00;
  sockaddr *__addr;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  QSize QVar9;
  qreal devicePixelRatio;
  QOpenGLFramebufferObjectFormat fboFormat;
  QSurfaceFormat local_50 [8];
  QSize local_48;
  QSize local_40;
  long local_38;
  long lVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  initialize(this);
  QOpenGLContext::makeCurrent((QSurface *)(this->context).d);
  iVar3 = QWindow::geometry();
  dVar7 = (double)QWindow::devicePixelRatio();
  QWindow::geometry();
  dVar8 = (double)QWindow::devicePixelRatio();
  QVar9.wd.m_i = (int)(dVar7 * (double)((extraout_EDX - iVar3) + 1));
  QVar9.ht.m_i = (int)(dVar8 * (double)((extraout_var_00 - extraout_var) + 1));
  local_40 = QVar9;
  if ((int)this->updateBehavior < 1) {
    QPaintDeviceWindowPrivate::markWindowAsDirty(&this->super_QPaintDeviceWindowPrivate);
  }
  else {
    pQVar2 = (this->fbo).d;
    if (((pQVar2 == (QOpenGLFramebufferObject *)0x0) ||
        (QVar4 = QOpenGLFramebufferObject::size(pQVar2), QVar9.wd.m_i != QVar4.wd.m_i.m_i)) ||
       (QVar9.ht.m_i != QVar4.ht.m_i.m_i)) {
      local_48 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLFramebufferObjectFormat::QOpenGLFramebufferObjectFormat
                ((QOpenGLFramebufferObjectFormat *)&local_48);
      QOpenGLFramebufferObjectFormat::setAttachment
                ((QOpenGLFramebufferObjectFormat *)&local_48,CombinedDepthStencil);
      QWindow::requestedFormat();
      iVar3 = QSurfaceFormat::samples();
      QSurfaceFormat::~QSurfaceFormat(local_50);
      if (0 < iVar3) {
        if (this->updateBehavior == PartialUpdateBlend) {
          beginPaint();
        }
        else {
          QOpenGLFramebufferObjectFormat::setSamples
                    ((QOpenGLFramebufferObjectFormat *)&local_48,iVar3);
        }
      }
      this_01 = (QOpenGLFramebufferObject *)operator_new(0x10);
      QOpenGLFramebufferObject::QOpenGLFramebufferObject
                (this_01,&local_40,(QOpenGLFramebufferObjectFormat *)&local_48);
      pQVar2 = (this->fbo).d;
      if ((pQVar2 != this_01) &&
         ((this->fbo).d = this_01, pQVar2 != (QOpenGLFramebufferObject *)0x0)) {
        (*pQVar2->_vptr_QOpenGLFramebufferObject[1])();
      }
      QPaintDeviceWindowPrivate::markWindowAsDirty(&this->super_QPaintDeviceWindowPrivate);
      QOpenGLFramebufferObjectFormat::~QOpenGLFramebufferObjectFormat
                ((QOpenGLFramebufferObjectFormat *)&local_48);
    }
  }
  local_48 = QVar9;
  QOpenGLPaintDevice::setSize(&((this->paintDevice).d)->super_QOpenGLPaintDevice,&local_48);
  this_00 = (this->paintDevice).d;
  devicePixelRatio = (qreal)QWindow::devicePixelRatio();
  QOpenGLPaintDevice::setDevicePixelRatio(&this_00->super_QOpenGLPaintDevice,devicePixelRatio);
  plVar5 = (long *)QOpenGLContext::functions();
  (**(code **)(*plVar5 + 0x170))(0,0,QVar9.wd.m_i,QVar9.ht.m_i);
  plVar5 = (long *)QOpenGLContext::functions();
  iVar3 = QOpenGLContext::defaultFramebufferObject();
  if (iVar3 == 0) {
    QOpenGLContext::currentContext();
    iVar3 = QOpenGLContext::defaultFramebufferObject();
  }
  lVar6 = *plVar5;
  (**(code **)(lVar6 + 0x198))(0x8d40);
  __len = (socklen_t)lVar6;
  (**(code **)(*plVar1 + 0x150))(plVar1);
  if (0 < (int)this->updateBehavior) {
    QOpenGLFramebufferObject::bind((this->fbo).d,iVar3,__addr,__len);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLWindowPrivate::beginPaint(const QRegion &region)
{
    Q_UNUSED(region);
    Q_Q(QOpenGLWindow);

    initialize();
    context->makeCurrent(q);

    const int deviceWidth = q->width() * q->devicePixelRatio();
    const int deviceHeight = q->height() * q->devicePixelRatio();
    const QSize deviceSize(deviceWidth, deviceHeight);
    if (updateBehavior > QOpenGLWindow::NoPartialUpdate) {
        if (!fbo || fbo->size() != deviceSize) {
            QOpenGLFramebufferObjectFormat fboFormat;
            fboFormat.setAttachment(QOpenGLFramebufferObject::CombinedDepthStencil);
            const int samples = q->requestedFormat().samples();
            if (samples > 0) {
                if (updateBehavior != QOpenGLWindow::PartialUpdateBlend)
                    fboFormat.setSamples(samples);
                else
                    qWarning("QOpenGLWindow: PartialUpdateBlend does not support multisampling");
            }
            fbo.reset(new QOpenGLFramebufferObject(deviceSize, fboFormat));
            markWindowAsDirty();
        }
    } else {
        markWindowAsDirty();
    }

    paintDevice->setSize(QSize(deviceWidth, deviceHeight));
    paintDevice->setDevicePixelRatio(q->devicePixelRatio());
    context->functions()->glViewport(0, 0, deviceWidth, deviceHeight);

    context->functions()->glBindFramebuffer(GL_FRAMEBUFFER, context->defaultFramebufferObject());

    q->paintUnderGL();

    if (updateBehavior > QOpenGLWindow::NoPartialUpdate)
        fbo->bind();
}